

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproperty.cpp
# Opt level: O1

void __thiscall QBindingStoragePrivate::destroy(QBindingStoragePrivate *this)

{
  ulong uVar1;
  QBindingStorageData *ptr;
  size_t *this_00;
  ulong uVar2;
  
  if (*this->d != (QBindingStorageData *)0x0) {
    ptr = *this->d;
    uVar1 = ptr->size;
    if (uVar1 != 0) {
      this_00 = &(*this->d)[1].used;
      uVar2 = 0;
      do {
        if (((QBindingStorageData *)(this_00 + -1))->size != 0) {
          QtPrivate::QPropertyBindingData::~QPropertyBindingData((QPropertyBindingData *)this_00);
        }
        uVar2 = uVar2 + 1;
        ptr = *this->d;
        uVar1 = ptr->size;
        this_00 = this_00 + 2;
      } while (uVar2 < uVar1);
    }
    QtPrivate::sizedFree(ptr,uVar1 * 0x10 + 0x10);
    return;
  }
  return;
}

Assistant:

void destroy()
    {
        if (!d)
            return;
        Pair *p = pairs(d);
        for (size_t i = 0; i < d->size; ++i) {
            if (p->data)
                p->~Pair();
            ++p;
        }
        const size_t allocSize = sizeof(QBindingStorageData) + d->size*sizeof(Pair);
        QtPrivate::sizedFree(d, allocSize);
    }